

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

char * helicsQueryExecuteComplete(HelicsQuery query,HelicsError *err)

{
  uint uVar1;
  QueryObject *pQVar2;
  char *pcVar3;
  QueryId local_3c;
  string local_38;
  
  pQVar2 = anon_unknown.dwarf_1862f::getQueryObj(query,err);
  if (pQVar2 == (QueryObject *)0x0) {
    pcVar3 = 
    "{{\n  \"error\":{{\n    \"code\":400,\n    \"message\":\"query object is not valid\"\n  }}\n}}"
    ;
  }
  else {
    uVar1 = (pQVar2->asyncIndexCode).ivalue;
    if (uVar1 != 0xffffffff) {
      local_3c.ivalue = uVar1;
      helics::Federate::queryComplete_abi_cxx11_
                (&local_38,
                 (pQVar2->activeFed).
                 super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_3c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&pQVar2->response,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    pQVar2->activeAsync = false;
    local_38._M_dataplus._M_p = (pointer)0x0;
    local_38._M_string_length = 0;
    std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pQVar2->activeFed).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
    (pQVar2->asyncIndexCode).ivalue = 0xffffffff;
    pcVar3 = (pQVar2->response)._M_dataplus._M_p;
  }
  return pcVar3;
}

Assistant:

const char* helicsQueryExecuteComplete(HelicsQuery query, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return invalidQueryObConst;
    }
    try {
        if (queryObj->asyncIndexCode.isValid()) {
            queryObj->response = queryObj->activeFed->queryComplete(queryObj->asyncIndexCode);
        }
        queryObj->activeAsync = false;
        queryObj->activeFed = nullptr;
        queryObj->asyncIndexCode = helics::QueryId();
        return queryObj->response.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return queryErrorString;
    // LCOV_EXCL_STOP
}